

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_transcript.cc
# Opt level: O3

bool __thiscall
bssl::SSLTranscript::InitHash(SSLTranscript *this,uint16_t version,SSL_CIPHER *cipher)

{
  bool bVar1;
  EVP_MD *digest;
  EVP_MD *pEVar2;
  bool bVar3;
  
  this->version_ = version;
  digest = ssl_get_handshake_digest(version,cipher);
  pEVar2 = EVP_MD_CTX_get0_md(&(this->hash_).ctx_);
  bVar3 = true;
  if (pEVar2 != digest) {
    bVar1 = HashBuffer(this,&(this->hash_).ctx_,digest);
    if (bVar1) {
      if (((this->field_0x28 & 1) != 0) && (0x303 < this->version_)) {
        std::__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter> *)this,(pointer)0x0);
      }
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool SSLTranscript::InitHash(uint16_t version, const SSL_CIPHER *cipher) {
  version_ = version;
  const EVP_MD *md = ssl_get_handshake_digest(version, cipher);
  if (Digest() == md) {
    // No need to re-hash the buffer.
    return true;
  }
  if (!HashBuffer(hash_.get(), md)) {
    return false;
  }
  if (is_dtls_ && version_ >= TLS1_3_VERSION) {
    // In DTLS 1.3, prior to the call to InitHash, the message (if present) in
    // the buffer has the DTLS 1.2 header. After the call to InitHash, the TLS
    // 1.3 header is written by SSLTranscript::Update. If the buffer isn't freed
    // here, it would have a mix of different header formats and using it would
    // yield wrong results. However, there's no need for the buffer once the
    // version and the digest for the cipher suite are known, so the buffer is
    // freed here to avoid potential misuse of the SSLTranscript object.
    FreeBuffer();
  }
  return true;
}